

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O0

void __thiscall
Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::moveSampleList
          (TypedDeepImageChannel<Imath_3_2::half> *this,size_t i,uint oldNumSamples,
          uint newNumSamples,size_t newSampleListPosition)

{
  long lVar1;
  long lVar2;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  uint j_2;
  uint j_1;
  uint j;
  half *newSampleList;
  half *oldSampleList;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 local_38;
  undefined4 local_34;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0x30) + in_RSI * 8);
  lVar2 = *(long *)(in_RDI + 0x40) + in_R8 * 2;
  if (in_ECX < in_EDX) {
    for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
      *(undefined2 *)(lVar2 + (ulong)local_34 * 2) = *(undefined2 *)(lVar1 + (ulong)local_34 * 2);
    }
  }
  else {
    for (local_38 = 0; local_38 < in_EDX; local_38 = local_38 + 1) {
      *(undefined2 *)(lVar2 + (ulong)local_38 * 2) = *(undefined2 *)(lVar1 + (ulong)local_38 * 2);
    }
    for (; in_EDX < in_ECX; in_EDX = in_EDX + 1) {
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),(float)((ulong)in_RDI >> 0x20));
    }
  }
  *(long *)(*(long *)(in_RDI + 0x30) + in_RSI * 8) = lVar2;
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::moveSampleList (
    size_t       i,
    unsigned int oldNumSamples,
    unsigned int newNumSamples,
    size_t       newSampleListPosition)
{
    //
    // Resize the sample list for a single pixel and move it to a new
    // position in the sample buffer for this channel.
    //
    // i                        The position of the affected pixel in
    //                          the channel's _sampleListPointers.
    //
    // oldNumSamples            Original number of samples in sample list.
    //
    // newNumSamples            New number of samples in the sample list.
    //                          If the new number of samples is larger than
    //                          the old number of samples for a given sample
    //                          list, then the end of the new sample list
    //                          is filled with zeroes.  If the new number of
    //                          samples is smaller than the old one, then
    //                          samples at the end of the old sample list
    //                          are discarded.
    //
    // newSampleListPosition    The new position of the sample list in the
    //                          sample buffer.
    //

    T* oldSampleList = _sampleListPointers[i];
    T* newSampleList = _sampleBuffer + newSampleListPosition;

    if (oldNumSamples > newNumSamples)
    {
        for (unsigned int j = 0; j < newNumSamples; ++j)
            newSampleList[j] = oldSampleList[j];
    }
    else
    {
        for (unsigned int j = 0; j < oldNumSamples; ++j)
            newSampleList[j] = oldSampleList[j];

        for (unsigned int j = oldNumSamples; j < newNumSamples; ++j)
            newSampleList[j] = 0;
    }

    _sampleListPointers[i] = newSampleList;
}